

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalWatcomWMakeGenerator.cxx
# Opt level: O0

void cmGlobalWatcomWMakeGenerator::GetDocumentation(cmDocumentationEntry *entry)

{
  string local_30 [32];
  cmDocumentationEntry *local_10;
  cmDocumentationEntry *entry_local;
  
  local_10 = entry;
  GetActualName_abi_cxx11_();
  std::__cxx11::string::operator=((string *)local_10,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::operator=((string *)&local_10->Brief,"Generates Watcom WMake makefiles.");
  return;
}

Assistant:

void cmGlobalWatcomWMakeGenerator
::GetDocumentation(cmDocumentationEntry& entry)
{
  entry.Name = cmGlobalWatcomWMakeGenerator::GetActualName();
  entry.Brief = "Generates Watcom WMake makefiles.";
}